

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void affect_strip_room(ROOM_INDEX_DATA *room,int sn)

{
  short *psVar1;
  undefined8 *puVar2;
  int in_ESI;
  long in_RDI;
  ROOM_AFFECT_DATA *paf_next;
  ROOM_AFFECT_DATA *paf;
  ROOM_AFFECT_DATA *in_stack_00000028;
  ROOM_INDEX_DATA *in_stack_00000030;
  undefined8 local_18;
  
  local_18 = *(undefined8 **)(in_RDI + 0x160);
  while (local_18 != (undefined8 *)0x0) {
    puVar2 = (undefined8 *)*local_18;
    psVar1 = (short *)((long)local_18 + 0x14);
    local_18 = puVar2;
    if (*psVar1 == in_ESI) {
      affect_remove_room(in_stack_00000030,in_stack_00000028);
    }
  }
  return;
}

Assistant:

void affect_strip_room(ROOM_INDEX_DATA *room, int sn)
{
	ROOM_AFFECT_DATA *paf;
	ROOM_AFFECT_DATA *paf_next;

	for (paf = room->affected; paf != nullptr; paf = paf_next)
	{
		paf_next = paf->next;

		if (paf->type == sn)
			affect_remove_room(room, paf);
	}
}